

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O2

void __thiscall
TPZBlockDiagonal<std::complex<float>_>::Transpose
          (TPZBlockDiagonal<std::complex<float>_> *this,TPZMatrix<std::complex<float>_> *T)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  long local_78;
  
  iVar2 = (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  iVar3 = (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])(this);
  (*(T->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xd])
            (T,CONCAT44(extraout_var,iVar2),CONCAT44(extraout_var_00,iVar3));
  lVar4 = (this->fBlockSize).fNElements;
  local_78 = 0;
  if (lVar4 < 1) {
    lVar4 = 0;
  }
  for (lVar6 = 0; lVar6 != lVar4; lVar6 = lVar6 + 1) {
    uVar1 = (this->fBlockSize).fStore[lVar6];
    uVar8 = 0;
    if (0 < (int)uVar1) {
      uVar8 = (ulong)uVar1;
    }
    lVar10 = (this->fBlockPos).fStore[lVar6] << 3;
    for (uVar5 = 0; uVar5 != uVar8; uVar5 = uVar5 + 1) {
      uVar7 = (ulong)uVar1;
      lVar9 = local_78;
      lVar11 = lVar10;
      while (bVar12 = uVar7 != 0, uVar7 = uVar7 - 1, bVar12) {
        (*(T->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (T,local_78 + uVar5,lVar9,(long)&((this->fStorage).fStore)->_M_value + lVar11);
        lVar9 = lVar9 + 1;
        lVar11 = lVar11 + 8;
      }
      lVar10 = lVar10 + (long)(int)uVar1 * 8;
    }
    local_78 = local_78 + (int)uVar1;
  }
  return;
}

Assistant:

void TPZBlockDiagonal<TVar>::Transpose (TPZMatrix<TVar> *const T) const
{
	T->Resize( Dim(), Dim() );
	
	int64_t b, eq = 0, pos;
	int bsize, r, c;
	int64_t nb = fBlockSize.NElements();
	for ( b=0; b<nb; b++) {
		pos= fBlockPos[b];
		bsize = fBlockSize[b];
		for(r=0; r<bsize; r++) {
			for(c=0; c<bsize; c++) {
				T->PutVal(eq+r,eq+c,fStorage[pos+c+r*bsize]);
			}
		}
		eq += bsize;
	}
}